

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>
::operator+=(List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>
             *this,List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
                   *column)

{
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *column_local;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *this_local;
  
  _add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>
            (this,column);
  return (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
          *)this;
}

Assistant:

inline List_column<Master_matrix>& List_column<Master_matrix>::operator+=(const Entry_range& column)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, List_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  _add(column);

  return *this;
}